

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O3

char * embree::parseSep(char **token)

{
  char *__s;
  char *pcVar1;
  runtime_error *this;
  
  __s = *token;
  pcVar1 = (char *)strspn(__s," \t");
  if (pcVar1 != (char *)0x0) {
    *token = __s + (long)pcVar1;
    return pcVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"separator expected");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline const char* parseSep(const char*& token) {
    size_t sep = strspn(token, " \t");
    if (!sep) THROW_RUNTIME_ERROR("separator expected");
    return token+=sep;
  }